

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O3

void __thiscall
enact::FunctionTypename::FunctionTypename
          (FunctionTypename *this,
          unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
          *returnTypename,
          vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
          *argumentTypenames)

{
  pointer puVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *typename_;
  pointer puVar3;
  string separator;
  ostringstream name;
  char *local_1f8;
  char *local_1f0;
  char local_1e8;
  undefined7 uStack_1e7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  long local_1d0;
  string local_1c8;
  undefined7 uStack_1c7;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__FunctionTypename_00127988;
  (this->m_returnTypename)._M_t.
  super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
  super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
  super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl =
       (returnTypename->_M_t).
       super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
       super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl;
  (returnTypename->_M_t).
  super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
  super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
  super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl = (Typename *)0x0;
  puVar3 = (argumentTypenames->
           super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->m_argumentTypenames).
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (argumentTypenames->
       super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->m_argumentTypenames).
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar3;
  (this->m_argumentTypenames).
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (argumentTypenames->
       super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (argumentTypenames->
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (argumentTypenames->
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (argumentTypenames->
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)local_1d8;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1d0 = (long)(argumentTypenames->
                    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(argumentTypenames->
                    super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
  if (local_1d0 != 8) {
    local_1f8 = (char *)CONCAT71(local_1f8._1_7_,0x28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1f8,1);
  }
  local_1f8 = &local_1e8;
  local_1f0 = (char *)0x0;
  local_1e8 = '\0';
  puVar3 = (this->m_argumentTypenames).
           super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_argumentTypenames).
           super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar1) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_1f8,(long)local_1f0);
      iVar2 = (*((puVar3->_M_t).
                 super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
                 .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->
                _vptr_Typename[4])();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,*(char **)CONCAT44(extraout_var,iVar2),
                 ((undefined8 *)CONCAT44(extraout_var,iVar2))[1]);
      std::__cxx11::string::_M_replace((ulong)&local_1f8,0,local_1f0,0x11d1ad);
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
  }
  if (local_1d0 != 8) {
    local_1c8 = (string)0x29;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1c8,1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," => ",4);
  iVar2 = (*((this->m_returnTypename)._M_t.
             super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
             .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename[4]
          )();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,*(char **)CONCAT44(extraout_var_00,iVar2),
             ((undefined8 *)CONCAT44(extraout_var_00,iVar2))[1]);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_name,&local_1c8);
  if ((long *)CONCAT71(uStack_1c7,local_1c8) != local_1b8) {
    operator_delete((long *)CONCAT71(uStack_1c7,local_1c8),local_1b8[0] + 1);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

FunctionTypename::FunctionTypename(std::unique_ptr<const Typename> returnTypename,
                                       std::vector<std::unique_ptr<const Typename>> argumentTypenames) :
            m_returnTypename{std::move(returnTypename)},
            m_argumentTypenames{std::move(argumentTypenames)} {
        std::ostringstream name{};

        const bool wrap = argumentTypenames.size() != 1;

        if (wrap) name << '(';

        std::string separator{};
        for (const auto& typename_ : m_argumentTypenames) {
            name << separator;
            name << typename_->name();
            separator = ", ";
        }

        if (wrap) name << ')';
        name << " => " << m_returnTypename->name();

        m_name = name.str();
    }